

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F.cpp
# Opt level: O1

Sequence * __thiscall Finv::operator()(Sequence *__return_storage_ptr__,Finv *this,Sequence *seq)

{
  deque<int,_std::allocator<int>_> *this_00;
  deque<int,_std::allocator<int>_> *this_01;
  int iVar1;
  pointer pSVar2;
  Sequence sbox;
  Sequence tmp;
  value_type key;
  Sequence expansion;
  Sequence local_240;
  Sequence local_1e8;
  Sequence local_190;
  SequenceD<48> local_138;
  Sequence local_88;
  
  Sequence::permutation(&local_88,seq,&EXPANSION_PERMUTATION);
  iVar1 = this->m_round;
  this->m_round = iVar1 + 1;
  pSVar2 = (this->m_keys).super__Vector_base<SequenceD<48>,_std::allocator<SequenceD<48>_>_>._M_impl
           .super__Vector_impl_data._M_start;
  this_00 = &local_138.super_Sequence.m_bits;
  local_138.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque(this_00,&pSVar2[iVar1].super_Sequence.m_bits);
  this_01 = &local_138.m_other.m_bits;
  local_138.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d70;
  local_138.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::deque<int,_std::allocator<int>_>::deque(this_01,&pSVar2[iVar1].m_other.m_bits);
  toSequence<48>(&local_1e8,&local_138);
  Sequence::operator*(&local_190,&local_88,&local_1e8);
  local_1e8._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_1e8.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  S_function::operator()(&local_240,&this->m_sFunction,&local_190);
  Sequence::permutation(__return_storage_ptr__,&local_240,&PERMUTATION_FUNCTION);
  local_240._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_240.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_190._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_190.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_138.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d70;
  local_138.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&this_01->super__Deque_base<int,_std::allocator<int>_>);
  local_138.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&this_00->super__Deque_base<int,_std::allocator<int>_>);
  local_88._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_88.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

Sequence Finv::operator()(Sequence &seq) {
    auto expansion = seq.permutation(EXPANSION_PERMUTATION);
    // use the indexed intermediate key
    auto key = m_keys[m_round++];
    auto tmp = expansion * toSequence(key);
    auto sbox = m_sFunction(tmp);
    auto permutation = sbox.permutation(PERMUTATION_FUNCTION);
    return permutation;
}